

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

string * pbrt::anon_unknown_189::normalizeArg(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = pcVar2[sVar4];
    if ((bVar1 != 0x2d) && (bVar1 != 0x5f)) {
      tolower((uint)bVar1);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalizeArg(const std::string &str) {
    std::string ret;
    for (unsigned char c : str) {
        if (c != '_' && c != '-')
            ret += std::tolower(c);
    }
    return ret;
}